

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O2

int effectiveTextMargin(int defaultMargin,SideWidgetEntryList *widgets,
                       SideWidgetParameters *parameters)

{
  pointer pSVar1;
  bool bVar2;
  QLineEditIconButton *this;
  int iVar3;
  pointer pSVar4;
  
  pSVar4 = (widgets->
           super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (widgets->
           super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar4 != pSVar1) {
    iVar3 = 0;
    for (; pSVar4 != pSVar1; pSVar4 = pSVar4 + 1) {
      this = QtPrivate::qobject_cast_helper<QLineEditIconButton*,QObject>
                       (&pSVar4->widget->super_QObject);
      if (this == (QLineEditIconButton *)0x0) {
        bVar2 = QWidget::isVisibleTo
                          (pSVar4->widget,*(QWidget **)(*(long *)&pSVar4->widget->field_0x8 + 0x10))
        ;
      }
      else {
        bVar2 = QLineEditIconButton::needsSpace(this);
      }
      iVar3 = iVar3 + (uint)bVar2;
    }
    defaultMargin = defaultMargin + (parameters->widgetWidth + parameters->margin) * iVar3;
  }
  return defaultMargin;
}

Assistant:

static int effectiveTextMargin(int defaultMargin, const QLineEditPrivate::SideWidgetEntryList &widgets,
                               const QLineEditPrivate::SideWidgetParameters &parameters)
{
    if (widgets.empty())
        return defaultMargin;

    const auto visibleSideWidgetCount = std::count_if(widgets.begin(), widgets.end(),
                             [](const QLineEditPrivate::SideWidgetEntry &e) {
#if QT_CONFIG(toolbutton) && QT_CONFIG(animation)
        // a button that's fading out doesn't get any space
        if (auto* iconButton = qobject_cast<QLineEditIconButton*>(e.widget))
            return iconButton->needsSpace();

#endif
        return e.widget->isVisibleTo(e.widget->parentWidget());
    });

    return defaultMargin + (parameters.margin + parameters.widgetWidth) * visibleSideWidgetCount;
}